

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

char * do_with_oh<char_const*>
                 (qpdf_data qpdf,qpdf_oh oh,function<const_char_*()> *fallback,
                 function<const_char_*(QPDFObjectHandle_&)> *fn)

{
  size_t *psVar1;
  undefined1 this [8];
  uint uVar2;
  _Node *p_Var3;
  char *cstr;
  Pipeline *this_00;
  _func_int **pp_Var4;
  char *ret;
  undefined1 local_e8 [8];
  undefined1 local_e0 [24];
  _Invoker_type p_Stack_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [16];
  function<const_char_*(QPDFObjectHandle_&)> local_a0;
  qpdf_oh local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  std::function<const_char_*()>::function((function<const_char_*()> *)&local_38,fallback);
  std::function<const_char_*(QPDFObjectHandle_&)>::function(&local_a0,fn);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_80 = oh;
  local_78._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_78._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x10) = 0;
  *(_Invoker_type *)((long)local_78._M_unused._0_8_ + 0x18) = local_a0._M_invoker;
  if (local_a0.super__Function_base._M_manager != (_Manager_type)0x0) {
    *(void **)local_78._M_unused._0_8_ =
         local_a0.super__Function_base._M_functor._M_unused._M_object;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) =
         local_a0.super__Function_base._M_functor._8_8_;
    *(_Manager_type *)((long)local_78._M_unused._0_8_ + 0x10) =
         local_a0.super__Function_base._M_manager;
    local_a0.super__Function_base._M_manager = (_Manager_type)0x0;
    local_a0._M_invoker = (_Invoker_type)0x0;
  }
  *(qpdf_oh *)((long)local_78._M_unused._0_8_ + 0x20) = oh;
  pcStack_60 = std::
               _Function_handler<const_char_*(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<const_char_*(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
             ::_M_manager;
  local_e8 = (undefined1  [8])local_b0;
  std::function<const_char_*(_qpdf_data_*)>::function
            ((function<const_char_*(_qpdf_data_*)> *)local_e0,
             (function<const_char_*(_qpdf_data_*)> *)&local_78);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x28);
  *(undefined1 (*) [8])local_58._M_unused._0_8_ = local_e8;
  *(long *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(long *)((long)local_58._M_unused._0_8_ + 0x10) = 0;
  *(long *)((long)local_58._M_unused._0_8_ + 0x18) = 0;
  *(_Invoker_type *)((long)local_58._M_unused._0_8_ + 0x20) = p_Stack_c8;
  if ((code *)local_e0._16_8_ != (code *)0x0) {
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_e0._0_8_;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = local_e0._8_8_;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x18) = local_e0._16_8_;
    local_e0._16_8_ = (code *)0x0;
    p_Stack_c8 = (_Invoker_type)0x0;
  }
  pcStack_40 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
             ::_M_manager;
  uVar2 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((code *)local_e0._16_8_ != (code *)0x0) {
    (*(code *)local_e0._16_8_)
              ((function<const_char_*(_qpdf_data_*)> *)local_e0,
               (function<const_char_*(_qpdf_data_*)> *)local_e0,3);
  }
  pp_Var4 = (_func_int **)local_b0._0_8_;
  if (1 < uVar2) {
    if (qpdf->silence_errors == false) {
      if (qpdf->oh_error_occurred == false) {
        local_c0._M_allocated_capacity._0_4_ = 1;
        QPDF::getFilename_abi_cxx11_
                  ((string *)local_e8,
                   (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_b0._12_4_ = 0;
        p_Var3 = std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
                 _M_create_node<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                           ((list<QPDFExc,std::allocator<QPDFExc>> *)&qpdf->warnings,
                            (qpdf_error_code_e *)&local_c0._M_allocated_capacity,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_e8,(char (*) [1])0x27d0e6,(int *)(local_b0 + 0xc),
                            (char (*) [129])
                            "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                           );
        std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
        psVar1 = &(qpdf->warnings).super__List_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_e8 != (undefined1  [8])(local_e0 + 8)) {
          operator_delete((void *)local_e8,local_e0._8_8_ + 1);
        }
        qpdf->oh_error_occurred = true;
      }
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)local_e8,SUB41(local_c0._M_allocated_capacity._0_4_,0));
      this = local_e8;
      cstr = (char *)(**(code **)(*(long *)(qpdf->error).
                                           super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 0x10))();
      this_00 = Pipeline::operator<<((Pipeline *)this,cstr);
      Pipeline::operator<<(this_00,"\n");
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._0_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
      }
    }
    if (local_28 == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    pp_Var4 = (_func_int **)(*local_20)(&local_38);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_a0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a0.super__Function_base._M_manager)(&local_a0,&local_a0,3);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return (char *)pp_Var4;
}

Assistant:

static RET
do_with_oh(
    qpdf_data qpdf,
    qpdf_oh oh,
    std::function<RET()> fallback,
    std::function<RET(QPDFObjectHandle&)> fn)
{
    return trap_oh_errors<RET>(qpdf, fallback, [fn, oh](qpdf_data q) {
        auto i = q->oh_cache.find(oh);
        bool result = ((i != q->oh_cache.end()) && (i->second).get());
        if (!result) {
            QTC::TC("qpdf", "qpdf-c invalid object handle");
            throw QPDFExc(
                qpdf_e_internal,
                q->qpdf->getFilename(),
                std::string("C API object handle ") + std::to_string(oh),
                0,
                "attempted access to unknown object handle");
        }
        return fn(*(q->oh_cache[oh]));
    });
}